

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

bool __thiscall ON_BrepTrim::Reverse(ON_BrepTrim *this)

{
  ON_Interval domain;
  bool bVar1;
  int iVar2;
  ON_Curve *this_00;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  ON_Interval trim_domain;
  ON_Interval local_30;
  
  ON_SimpleArray<ON_BrepTrimPoint>::Destroy(&this->m_pline);
  ON_Curve::DestroyCurveTree((ON_Curve *)this);
  if (this->m_brep != (ON_Brep *)0x0) {
    (*(this->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
      [0x25])(this);
    local_30.m_t[0] = extraout_XMM0_Qa;
    local_30.m_t[1] = in_XMM1_Qa;
    bVar1 = ON_Brep::StandardizeTrimCurve(this->m_brep,this->m_trim_index);
    if ((bVar1) && (this_00 = TrimCurveOf(this), this_00 != (ON_Curve *)0x0)) {
      iVar2 = (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(this_00);
      ON_Interval::Reverse(&local_30);
      domain.m_t[1] = local_30.m_t[1];
      domain.m_t[0] = local_30.m_t[0];
      ON_Curve::SetDomain(this_00,domain);
      ON_CurveProxy::SetProxyCurve(&this->super_ON_CurveProxy,this_00);
      if ((char)iVar2 != '\0') goto LAB_004101f8;
    }
  }
  bVar1 = ON_CurveProxy::Reverse(&this->super_ON_CurveProxy);
  if (!bVar1) {
    return false;
  }
LAB_004101f8:
  *(ulong *)this->m_vi =
       CONCAT44((int)*(undefined8 *)this->m_vi,(int)((ulong)*(undefined8 *)this->m_vi >> 0x20));
  if (-1 < this->m_ei) {
    this->m_bRev3d = (bool)(this->m_bRev3d ^ 1);
  }
  return true;
}

Assistant:

bool ON_BrepTrim::Reverse()
{
  m_pline.Destroy();
  DestroyCurveTree();

  bool rc = false;
  if ( m_brep )
  {
    ON_Interval trim_domain = Domain();
    if ( m_brep->StandardizeTrimCurve( m_trim_index ) )
    {
      ON_Curve* c2 = const_cast<ON_Curve*>(TrimCurveOf());
      if ( c2 )
      {
        rc = c2->Reverse();
        trim_domain.Reverse();
        c2->SetDomain(trim_domain);
        SetProxyCurve(c2);
      }
    }
  }

  if ( !rc )
    rc = ON_CurveProxy::Reverse();

  if (rc)
  {
    int i = m_vi[0];
    m_vi[0] = m_vi[1];
    m_vi[1] = i;
    if ( m_ei >= 0 )
      m_bRev3d = m_bRev3d ? false : true;
  }
  return rc;
}